

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::ComputeEigenvector1
          (TPZTensor<double> *this,TPZManVector<double,_3> *eigenvector0,double *eigenvalue1,
          TPZManVector<double,_3> *eigenvector1)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_118;
  TPZManVector<double,_3> U;
  TPZManVector<double,_3> V;
  TPZManVector<double,_3> AU;
  TPZManVector<double,_3> AV;
  
  TPZManVector<double,_3>::TPZManVector(&U,3);
  TPZManVector<double,_3>::TPZManVector(&V,3);
  pdVar1 = (eigenvector0->super_TPZVec<double>).fStore;
  dVar2 = *pdVar1;
  dVar4 = pdVar1[1];
  dVar3 = pdVar1[2];
  if (ABS(dVar2) <= ABS(dVar4)) {
    *U.super_TPZVec<double>.fStore = 0.0;
    dVar2 = 1.0 / SQRT(dVar4 * dVar4 + dVar3 * dVar3);
    U.super_TPZVec<double>.fStore[1] = pdVar1[2] * dVar2;
    dVar2 = -pdVar1[1] * dVar2;
  }
  else {
    dVar2 = 1.0 / SQRT(dVar2 * dVar2 + dVar3 * dVar3);
    *U.super_TPZVec<double>.fStore = -dVar3 * dVar2;
    U.super_TPZVec<double>.fStore[1] = 0.0;
    dVar2 = dVar2 * *pdVar1;
  }
  U.super_TPZVec<double>.fStore[2] = dVar2;
  Cross<double>(&eigenvector0->super_TPZVec<double>,&U.super_TPZVec<double>,&V.super_TPZVec<double>)
  ;
  TPZManVector<double,_3>::TPZManVector(&AU,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  *AU.super_TPZVec<double>.fStore =
       pdVar1[2] * U.super_TPZVec<double>.fStore[2] +
       *pdVar1 * *U.super_TPZVec<double>.fStore + pdVar1[1] * U.super_TPZVec<double>.fStore[1];
  AU.super_TPZVec<double>.fStore[1] =
       pdVar1[4] * U.super_TPZVec<double>.fStore[2] +
       pdVar1[1] * *U.super_TPZVec<double>.fStore + pdVar1[3] * U.super_TPZVec<double>.fStore[1];
  AU.super_TPZVec<double>.fStore[2] =
       pdVar1[5] * U.super_TPZVec<double>.fStore[2] +
       pdVar1[2] * *U.super_TPZVec<double>.fStore + pdVar1[4] * U.super_TPZVec<double>.fStore[1];
  TPZManVector<double,_3>::TPZManVector(&AV,3);
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  dVar4 = pdVar1[2] * V.super_TPZVec<double>.fStore[2] +
          *pdVar1 * *V.super_TPZVec<double>.fStore + pdVar1[1] * V.super_TPZVec<double>.fStore[1];
  *AV.super_TPZVec<double>.fStore = dVar4;
  dVar6 = pdVar1[4] * V.super_TPZVec<double>.fStore[2] +
          pdVar1[1] * *V.super_TPZVec<double>.fStore + pdVar1[3] * V.super_TPZVec<double>.fStore[1];
  AV.super_TPZVec<double>.fStore[1] = dVar6;
  dVar5 = pdVar1[5] * V.super_TPZVec<double>.fStore[2] +
          pdVar1[2] * *V.super_TPZVec<double>.fStore + pdVar1[4] * V.super_TPZVec<double>.fStore[1];
  AV.super_TPZVec<double>.fStore[2] = dVar5;
  local_118 = U.super_TPZVec<double>.fStore[2] * dVar5 +
              *U.super_TPZVec<double>.fStore * dVar4 + dVar6 * U.super_TPZVec<double>.fStore[1];
  dVar3 = ABS(local_118);
  dVar2 = (AU.super_TPZVec<double>.fStore[2] * U.super_TPZVec<double>.fStore[2] +
          *AU.super_TPZVec<double>.fStore * *U.super_TPZVec<double>.fStore +
          AU.super_TPZVec<double>.fStore[1] * U.super_TPZVec<double>.fStore[1]) - *eigenvalue1;
  dVar4 = (dVar5 * V.super_TPZVec<double>.fStore[2] +
          dVar4 * *V.super_TPZVec<double>.fStore + V.super_TPZVec<double>.fStore[1] * dVar6) -
          *eigenvalue1;
  dVar5 = ABS(dVar2);
  dVar6 = ABS(dVar4);
  if (dVar6 <= dVar5) {
    dVar4 = dVar3;
    if (dVar3 <= dVar5) {
      dVar4 = dVar5;
    }
    if (dVar4 <= 1e-09) goto LAB_00dda90c;
    if (dVar3 <= dVar5) {
      dVar2 = local_118 / dVar2;
      local_118 = 1.0 / SQRT(dVar2 * dVar2 + 1.0);
      dVar3 = dVar2 * local_118;
    }
    else {
      dVar2 = dVar2 / local_118;
      dVar3 = 1.0 / SQRT(dVar2 * dVar2 + 1.0);
      local_118 = dVar2 * dVar3;
    }
    sscal<double,double>(&U.super_TPZVec<double>,dVar3);
    TPZManVector<double,_3>::operator=(eigenvector1,&U);
  }
  else {
    dVar2 = dVar3;
    if (dVar3 <= dVar6) {
      dVar2 = dVar6;
    }
    if (dVar2 <= 1e-09) {
LAB_00dda90c:
      TPZManVector<double,_3>::operator=(eigenvector1,&U);
      goto LAB_00dda9c2;
    }
    if (dVar3 <= dVar6) {
      local_118 = local_118 / dVar4;
      dVar4 = 1.0 / SQRT(local_118 * local_118 + 1.0);
      local_118 = local_118 * dVar4;
    }
    else {
      dVar4 = dVar4 / local_118;
      local_118 = 1.0 / SQRT(dVar4 * dVar4 + 1.0);
      dVar4 = dVar4 * local_118;
    }
    sscal<double,double>(&U.super_TPZVec<double>,dVar4);
    TPZManVector<double,_3>::operator=(eigenvector1,&U);
  }
  saxpy<double,double,double>
            (&eigenvector1->super_TPZVec<double>,&V.super_TPZVec<double>,-local_118);
LAB_00dda9c2:
  TPZManVector<double,_3>::~TPZManVector(&AV);
  TPZManVector<double,_3>::~TPZManVector(&AU);
  TPZManVector<double,_3>::~TPZManVector(&V);
  TPZManVector<double,_3>::~TPZManVector(&U);
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvector1(const TPZManVector<T, 3> &eigenvector0, const T &eigenvalue1, TPZManVector<T, 3> &eigenvector1) const {
    // Robustly compute a right-handed orthonormal set { U, V, evec0 }.
    TPZManVector<T, 3> U(3), V(3);

    // The vector eigenvector0 is guaranteed to be unit-length, in which case there is no
    // need to worry about a division by zero when computing invLength.
    T invLength;
    if (fabs(eigenvector0[0]) > fabs(eigenvector0[1])) {
        // The component of maximum absolute value is either eigenvector0[0] or eigenvector0[2].
        invLength = (T) 1 / sqrt(eigenvector0[0] * eigenvector0[0] + eigenvector0[2] * eigenvector0[2]);
        U[0] = -eigenvector0[2] * invLength;
        U[1] = T(0.);
        U[2] = +eigenvector0[0] * invLength;
    } else {
        // The component of maximum absolute value is either eigenvector0[1] or eigenvector0[2].
        invLength = (T) 1 / sqrt(eigenvector0[1] * eigenvector0[1] + eigenvector0[2] * eigenvector0[2]);
        U[0] = T(0.);
        U[1] = +eigenvector0[2] * invLength;
        U[2] = -eigenvector0[1] * invLength;
    }
    Cross(eigenvector0, U, V);

    // Let e be eigenvalue1 and let v1 be a corresponding eigenvector which is a
    // solution to the linear system (A - e*I)*v1 = 0.  The matrix (A - e*I)
    // is 3x3, not invertible (so infinitely many solutions), and has rank 2
    // when eigenvalue1 and eigenvalue2 are different.  It has rank 1 when eigenvalue1 and eigenvalue2
    // are equal.  Numerically, it is difficult to compute robustly the rank
    // of a matrix.  Instead, the 3x3 linear system is reduced to a 2x2 system
    // as follows.  Define the 3x2 matrix J = [U V] whose columns are the U
    // and V computed previously.  Define the 2x1 vector X = J*v1.  The 2x2
    // system is 0 = M * X = (J^T * (A - e*I) * J) * X where J^T is the
    // transpose of J and M = J^T * (A - e*I) * J is a 2x2 matrix.  The system
    // may be written as
    //     +-                        -++-  -+       +-  -+
    //     | U^T*A*U - e  U^T*A*V     || x0 | = e * | x0 |
    //     | V^T*A*U      V^T*A*V - e || x1 |       | x1 |
    //     +-                        -++   -+       +-  -+
    // where X has row entries x0 and x1.
    TPZManVector<T, 3> AU(3);
    AU[0] = XX() * U[0] + XY() * U[1] + XZ() * U[2];
    AU[1] = XY() * U[0] + YY() * U[1] + YZ() * U[2];
    AU[2] = XZ() * U[0] + YZ() * U[1] + ZZ() * U[2];

    TPZManVector<T, 3> AV(3);
    AV[0] = XX() * V[0] + XY() * V[1] + XZ() * V[2];
    AV[1] = XY() * V[0] + YY() * V[1] + YZ() * V[2];
    AV[2] = XZ() * V[0] + YZ() * V[1] + ZZ() * V[2];

    T m00 = U[0] * AU[0] + U[1] * AU[1] + U[2] * AU[2] - eigenvalue1;
    T m01 = U[0] * AV[0] + U[1] * AV[1] + U[2] * AV[2];
    T m11 = V[0] * AV[0] + V[1] * AV[1] + V[2] * AV[2] - eigenvalue1;

    // For robustness, choose the largest-length row of M to compute the
    // eigenvector.  The 2-tuple of coefficients of U and V in the
    // assignments to eigenvector[1] lies on a circle, and U and V are
    // unit length and perpendicular, so eigenvector[1] is unit length
    // (within numerical tolerance).
    REAL absM00 = fabs(TPZExtractVal::val(m00));
    REAL absM01 = fabs(TPZExtractVal::val(m01));
    REAL absM11 = fabs(TPZExtractVal::val(m11));
    REAL maxAbsComp;
    if (absM00 >= absM11) {
        maxAbsComp = std::max(absM00, absM01);
        if (IsZeroVal(maxAbsComp)) {
            eigenvector1 = U;
        } else {
            if (absM00 >= absM01) {
                m01 /= m00;
                m00 = T(1.) / sqrt(T(1.) + m01 * m01);
                m01 *= m00;
            } else {
                m00 /= m01;
                m01 = T(1.) / sqrt(T(1.) + m00 * m00);
                m00 *= m01;
            }
            //eigenvector1 = m01*U - m00*V
            sscal(U, m01);
            eigenvector1 = U;
            saxpy(eigenvector1, V, -m00);
        }
    } else {
        maxAbsComp = std::max(absM11, absM01);
        if (IsZeroVal(maxAbsComp)) {
            eigenvector1 = U;
        } else {
            if (absM11 >= absM01) {
                m01 /= m11;
                m11 = T(1.) / sqrt(T(1.) + m01 * m01);
                m01 *= m11;
            } else {
                m11 /= m01;
                m01 = T(1.) / sqrt(T(1.) + m11 * m11);
                m11 *= m01;
            }
            //eigenvector1 = m11*U - m01*V
            sscal(U, m11);
            eigenvector1 = U;
            saxpy(eigenvector1, V, -m01);
        }
    }
}